

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::displayHand(Player *this,int row)

{
  pointer ppCVar1;
  ostream *poVar2;
  long *plVar3;
  pointer ppCVar4;
  Erase local_3c;
  Cursor local_34;
  
  AdvancedConsole::Cursor::Cursor(&local_34,row,0,AC_ABSOLUTE);
  poVar2 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_34);
  AdvancedConsole::Erase::Erase(&local_3c,AC_ALL,AC_LINE);
  poVar2 = AdvancedConsole::operator<<(poVar2,&local_3c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Your Hand: ",0xb);
  ppCVar1 = (this->_hand).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar4 = (this->_hand).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
    poVar2 = operator<<((ostream *)&std::cout,*ppCVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void Player::displayHand(int row) {
    cout << AdvancedConsole::Cursor(row, 0) << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE)
         << "Your Hand: ";
    for (Card *c: _hand) {
        cout << *c << "  ";
    }
    cout << endl << endl;

}